

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

int count_users(OBJ_DATA *obj)

{
  OBJ_DATA **ppOVar1;
  int iVar2;
  CHAR_DATA *pCVar3;
  
  iVar2 = 0;
  if ((obj->in_room != (ROOM_INDEX_DATA *)0x0) &&
     (pCVar3 = obj->in_room->people, iVar2 = 0, pCVar3 != (CHAR_DATA *)0x0)) {
    iVar2 = 0;
    do {
      ppOVar1 = &pCVar3->on;
      pCVar3 = pCVar3->next_in_room;
      iVar2 = iVar2 + (uint)(*ppOVar1 == obj);
    } while (pCVar3 != (CHAR_DATA *)0x0);
  }
  return iVar2;
}

Assistant:

int count_users(OBJ_DATA *obj)
{
	CHAR_DATA *fch;
	int count = 0;

	if (obj->in_room == nullptr)
		return 0;

	for (fch = obj->in_room->people; fch != nullptr; fch = fch->next_in_room)
	{
		if (fch->on == obj)
			count++;
	}

	return count;
}